

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherCWrapper.cpp
# Opt level: O0

Watcher_CAPI * remove_callback(efsw_watcher watcher)

{
  bool bVar1;
  reference ppWVar2;
  const_iterator local_38;
  Watcher_CAPI **local_30;
  Watcher_CAPI *local_28;
  Watcher_CAPI *callback;
  __normal_iterator<Watcher_CAPI_**,_std::vector<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>_>
  local_18;
  iterator i;
  efsw_watcher watcher_local;
  
  i._M_current = (Watcher_CAPI **)watcher;
  local_18._M_current =
       (Watcher_CAPI **)
       std::vector<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>::begin(&g_callbacks);
  while( true ) {
    callback = (Watcher_CAPI *)
               std::vector<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>::end(&g_callbacks);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<Watcher_CAPI_**,_std::vector<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>_>
                        *)&callback);
    if (!bVar1) break;
    ppWVar2 = __gnu_cxx::
              __normal_iterator<Watcher_CAPI_**,_std::vector<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>_>
              ::operator*(&local_18);
    local_28 = *ppWVar2;
    if ((Watcher_CAPI **)local_28->mWatcher == i._M_current) {
      __gnu_cxx::
      __normal_iterator<Watcher_CAPI*const*,std::vector<Watcher_CAPI*,std::allocator<Watcher_CAPI*>>>
      ::__normal_iterator<Watcher_CAPI**>
                ((__normal_iterator<Watcher_CAPI*const*,std::vector<Watcher_CAPI*,std::allocator<Watcher_CAPI*>>>
                  *)&local_38,&local_18);
      local_30 = (Watcher_CAPI **)
                 std::vector<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>::erase
                           (&g_callbacks,local_38);
      local_18._M_current = local_30;
    }
    else {
      __gnu_cxx::
      __normal_iterator<Watcher_CAPI_**,_std::vector<Watcher_CAPI_*,_std::allocator<Watcher_CAPI_*>_>_>
      ::operator++(&local_18);
    }
  }
  return (Watcher_CAPI *)0x0;
}

Assistant:

Watcher_CAPI* remove_callback( efsw_watcher watcher ) {
	std::vector<Watcher_CAPI*>::iterator i = g_callbacks.begin();

	while ( i != g_callbacks.end() ) {
		Watcher_CAPI* callback = *i;

		if ( callback->mWatcher == watcher )
			i = g_callbacks.erase( i );
		else
			++i;
	}

	return NULL;
}